

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O0

gfield * __thiscall gfield::pow<13,13>(gfield *this,bigint<13> *x,bigint<13> *y)

{
  bool bVar1;
  int iVar2;
  int local_4c;
  int j;
  int i;
  gfield a;
  bigint<13> *y_local;
  bigint<13> *x_local;
  gfield *this_local;
  
  a.super_gfint._24_8_ = y;
  gfield<13>((gfield *)&j,x);
  bVar1 = bigint<13>::hasbit((bigint<13> *)a.super_gfint._24_8_,0);
  if (bVar1) {
    (this->super_gfint).len = j;
    (this->super_gfint).digits[0] = (digit)i;
    (this->super_gfint).digits[1] = i._2_2_;
    *(undefined8 *)((this->super_gfint).digits + 2) = a.super_gfint._0_8_;
    *(undefined8 *)((this->super_gfint).digits + 6) = a.super_gfint.digits._4_8_;
    *(undefined4 *)((this->super_gfint).digits + 10) = a.super_gfint.digits._12_4_;
    (this->super_gfint).digits[0xc] = a.super_gfint.digits[8];
  }
  else {
    (this->super_gfint).len = 1;
    (this->super_gfint).digits[0] = 1;
    if (*(int *)a.super_gfint._24_8_ == 0) {
      return this;
    }
  }
  local_4c = 1;
  iVar2 = bigint<13>::numbits((bigint<13> *)a.super_gfint._24_8_);
  for (; local_4c < iVar2; local_4c = local_4c + 1) {
    square((gfield *)&j);
    bVar1 = bigint<13>::hasbit((bigint<13> *)a.super_gfint._24_8_,local_4c);
    if (bVar1) {
      mul<13>(this,(bigint<13> *)&j);
    }
  }
  return this;
}

Assistant:

gfield &pow(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        gfield a(x);
        if(y.hasbit(0)) *this = a;
        else
        {
            len = 1;
            digits[0] = 1;
            if(!y.len) return *this;
        }
        for(int i = 1, j = y.numbits(); i < j; i++)
        {
            a.square();
            if(y.hasbit(i)) mul(a);
        }
        return *this;
    }